

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *config,
          string *lang,string *arch)

{
  cmMakefile *pcVar1;
  bool bVar2;
  cmLocalGenerator *this_00;
  string compileFlags;
  undefined1 local_70 [64];
  
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70._0_8_ = local_70 + 0x10;
  local_70._8_8_ = (cmState *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_70[0x10] = '\0';
  pcVar1 = this->Makefile;
  AddLanguageFlags(this,(string *)local_70,target,Compile,lang,config);
  bVar2 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar2) {
    AppendFeatureOptions(this,(string *)local_70,lang,"IPO");
  }
  AddArchitectureFlags(this,(string *)local_70,target,lang,config,arch);
  bVar2 = std::operator==(lang,"Fortran");
  if (bVar2) {
    (*this->_vptr_cmLocalGenerator[0xf])(local_70 + 0x20,this,target,config);
    (*this->_vptr_cmLocalGenerator[6])(this,local_70,local_70 + 0x20);
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
  }
  AddCMP0018Flags(this,(string *)local_70,target,lang,config);
  AddVisibilityPresetFlags(this,(string *)local_70,target,lang);
  AddColorDiagnosticsFlags(this,(string *)local_70,lang);
  std::__cxx11::string::string((string *)(local_70 + 0x20),(string *)&pcVar1->DefineFlags);
  this_00 = (cmLocalGenerator *)local_70;
  (*this->_vptr_cmLocalGenerator[6])(this,this_00,local_70 + 0x20);
  std::__cxx11::string::~string((string *)(local_70 + 0x20));
  GetFrameworkFlags((string *)(local_70 + 0x20),this_00,lang,config,target);
  (*this->_vptr_cmLocalGenerator[6])(this,local_70,local_70 + 0x20);
  std::__cxx11::string::~string((string *)(local_70 + 0x20));
  if ((cmState *)local_70._8_8_ != (cmState *)0x0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  }
  AddCompileOptions(this,__return_storage_ptr__,target,lang,config);
  std::__cxx11::string::~string((string *)local_70);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmLocalGenerator::GetTargetCompileFlags(
  cmGeneratorTarget* target, std::string const& config,
  std::string const& lang, std::string const& arch)
{
  std::vector<BT<std::string>> flags;
  std::string compileFlags;

  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(compileFlags, target, cmBuildStep::Compile, lang,
                         config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(compileFlags, lang, "IPO");
  }

  this->AddArchitectureFlags(compileFlags, target, lang, config, arch);

  if (lang == "Fortran") {
    this->AppendFlags(compileFlags,
                      this->GetTargetFortranFlags(target, config));
  }

  this->AddCMP0018Flags(compileFlags, target, lang, config);
  this->AddVisibilityPresetFlags(compileFlags, target, lang);
  this->AddColorDiagnosticsFlags(compileFlags, lang);
  this->AppendFlags(compileFlags, mf->GetDefineFlags());
  this->AppendFlags(compileFlags,
                    this->GetFrameworkFlags(lang, config, target));

  if (!compileFlags.empty()) {
    flags.emplace_back(std::move(compileFlags));
  }
  this->AddCompileOptions(flags, target, lang, config);
  return flags;
}